

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase123::run(TestCase123 *this)

{
  ArrayDisposer **native;
  Builder builder_00;
  Builder builder_01;
  size_t sVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  word *pwVar3;
  int64_t iVar4;
  void *pvVar5;
  void *pvVar6;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar7;
  undefined8 in_stack_ffffffffffffbb10;
  Builder local_4448;
  Builder local_4420;
  char *local_4408;
  void *local_4400;
  word *local_43f8;
  void *local_43f0;
  bool local_43e1;
  undefined1 local_43e0 [7];
  bool _kj_shouldLog_3;
  Builder local_43b8;
  char *local_43a0;
  word *local_4398;
  size_t local_4390;
  int local_4388;
  bool local_4381;
  undefined1 auStack_4380 [7];
  bool _kj_shouldLog_2;
  Builder local_4370;
  size_t local_4348;
  int local_4340;
  bool local_4339;
  undefined1 local_4338 [7];
  bool _kj_shouldLog_1;
  int64_t local_4310;
  int local_4308;
  bool local_4301;
  undefined1 local_4300 [7];
  bool _kj_shouldLog;
  Builder local_42d8;
  Builder local_42b0;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> local_4288;
  undefined1 local_4278 [8];
  TestInitMessageBuilder builder2;
  SegmentInit init;
  Fault f_1;
  int local_416c;
  Fault local_4168;
  Fault f;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segs;
  Builder local_4140;
  ArrayPtr<capnp::word> local_4118;
  undefined1 local_4108 [8];
  MallocMessageBuilder builder;
  word buffer [2048];
  TestCase123 *this_local;
  
  native = &builder.moreSegments.builder.disposer;
  memset(native,0,0x4000);
  kj::ArrayPtr<capnp::word>::ArrayPtr<2048ul>(&local_4118,(word (*) [2048])native);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_4108,local_4118,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_4140,(MessageBuilder *)local_4108);
  builder_00._builder.capTable = (CapTableBuilder *)local_4140._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_4140._builder.capTable;
  builder_00._builder.data = local_4140._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_4140._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_ffffffffffffbb10;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_ffffffffffffbb10 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_ffffffffffffbb10 >> 0x30);
  initTestMessage(builder_00);
  AVar7 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_4108);
  f.exception = (Exception *)AVar7.ptr;
  sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
  if (sVar1 != 1) {
    local_416c = 1;
    f_1.exception =
         (Exception *)
         kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                   ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
              (&local_4168,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x83,FAILED,"(1) == (segs.size())","1, segs.size()",&local_416c,
               (unsigned_long *)&f_1);
    kj::_::Debug::Fault::fatal(&local_4168);
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0);
  pwVar3 = kj::ArrayPtr<const_capnp::word>::begin(pAVar2);
  if (pwVar3 != (word *)&builder.moreSegments.builder.disposer) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&init.wordsUsed,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x84,FAILED,"segs[0].begin() == buffer","");
    kj::_::Debug::Fault::fatal((Fault *)&init.wordsUsed);
  }
  kj::ArrayPtr<capnp::word>::ArrayPtr<2048ul>
            ((ArrayPtr<capnp::word> *)&builder2.allocations.builder.disposer,
             (word (*) [2048])&builder.moreSegments.builder.disposer);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0);
  init.space.size_ = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  local_4288 = kj::arrayPtr<capnp::MessageBuilder::SegmentInit>
                         ((SegmentInit *)&builder2.allocations.builder.disposer,1);
  TestInitMessageBuilder::TestInitMessageBuilder((TestInitMessageBuilder *)local_4278,local_4288);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_42b0,(MessageBuilder *)local_4278);
  builder_01._builder.capTable = (CapTableBuilder *)local_42b0._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_42b0._builder.capTable;
  builder_01._builder.data = local_42b0._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_42b0._builder._32_8_;
  builder_01._builder.dataSize = (int)in_stack_ffffffffffffbb10;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_ffffffffffffbb10 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_ffffffffffffbb10 >> 0x30);
  checkTestMessage(builder_01);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_42d8,(MessageBuilder *)local_4278);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64Field(&local_42d8,0x1e1b9);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_4300,(MessageBuilder *)local_4108);
  iVar4 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field((Builder *)local_4300);
  if (iVar4 != 0x1e1b9) {
    local_4301 = kj::_::Debug::shouldLog(ERROR);
    while (local_4301 != false) {
      local_4308 = 0x1e1b9;
      MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
                ((Builder *)local_4338,(MessageBuilder *)local_4108);
      local_4310 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                             ((Builder *)local_4338);
      kj::_::Debug::log<char_const(&)[79],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x8e,ERROR,
                 "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
                 ,(char (*) [79])
                  "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())",
                 &local_4308,&local_4310);
      local_4301 = false;
    }
  }
  sVar1 = kj::Vector<kj::Array<capnp::word>_>::size
                    ((Vector<kj::Array<capnp::word>_> *)
                     &builder2.super_MessageBuilder.allocatedArena);
  if (sVar1 != 0) {
    local_4339 = kj::_::Debug::shouldLog(ERROR);
    while (local_4339 != false) {
      local_4340 = 0;
      local_4348 = kj::Vector<kj::Array<capnp::word>_>::size
                             ((Vector<kj::Array<capnp::word>_> *)
                              &builder2.super_MessageBuilder.allocatedArena);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x92,ERROR,
                 "\"failed: expected \" \"(0) == (builder2.allocations.size())\", 0, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (0) == (builder2.allocations.size())",&local_4340
                 ,&local_4348);
      local_4339 = false;
    }
  }
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_4370,(MessageBuilder *)local_4278);
  Text::Reader::Reader((Reader *)auStack_4380,"foobarbaz");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            (&local_4370,(Reader)_auStack_4380);
  sVar1 = kj::Vector<kj::Array<capnp::word>_>::size
                    ((Vector<kj::Array<capnp::word>_> *)
                     &builder2.super_MessageBuilder.allocatedArena);
  if (sVar1 != 0) {
    local_4381 = kj::_::Debug::shouldLog(ERROR);
    while (local_4381 != false) {
      local_4388 = 0;
      local_4390 = kj::Vector<kj::Array<capnp::word>_>::size
                             ((Vector<kj::Array<capnp::word>_> *)
                              &builder2.super_MessageBuilder.allocatedArena);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x94,ERROR,
                 "\"failed: expected \" \"(0) == (builder2.allocations.size())\", 0, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (0) == (builder2.allocations.size())",&local_4388
                 ,&local_4390);
      local_4381 = false;
    }
  }
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0);
  sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  local_4398 = buffer + (sVar1 - 1);
  pvVar5 = kj::implicitCast<void*,capnp::word*>(&local_4398);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_43e0,(MessageBuilder *)local_4278);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            (&local_43b8,(Builder *)local_43e0);
  local_43a0 = Text::Builder::begin(&local_43b8);
  pvVar6 = kj::implicitCast<void*,char*>(&local_43a0);
  if (pvVar5 != pvVar6) {
    local_43e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_43e1 != false) {
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0);
      sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      local_43f8 = buffer + (sVar1 - 1);
      local_43f0 = kj::implicitCast<void*,capnp::word*>(&local_43f8);
      MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
                (&local_4448,(MessageBuilder *)local_4278);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_4420,&local_4448);
      local_4408 = Text::Builder::begin(&local_4420);
      local_4400 = kj::implicitCast<void*,char*>(&local_4408);
      kj::_::Debug::log<char_const(&)[154],void*,void*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x97,ERROR,
                 "\"failed: expected \" \"(kj::implicitCast<void*>(buffer + segs[0].size())) == (kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin()))\", kj::implicitCast<void*>(buffer + segs[0].size()), kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin())"
                 ,(char (*) [154])
                  "failed: expected (kj::implicitCast<void*>(buffer + segs[0].size())) == (kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin()))"
                 ,&local_43f0,&local_4400);
      local_43e1 = false;
    }
  }
  TestInitMessageBuilder::~TestInitMessageBuilder((TestInitMessageBuilder *)local_4278);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_4108);
  return;
}

Assistant:

TEST(Message, MessageBuilderInitSpaceAvailable) {
  word buffer[2048];
  memset(buffer, 0, sizeof(buffer));
  MallocMessageBuilder builder(buffer);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Find out how much space in `buffer` was used in order to use in initializing the new message.
  auto segs = builder.getSegmentsForOutput();
  ASSERT_EQ(1, segs.size());
  KJ_ASSERT(segs[0].begin() == buffer);

  MessageBuilder::SegmentInit init = { kj::ArrayPtr<word>(buffer), segs[0].size() };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(kj::arrayPtr(&init, 1));
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Ask builder2 to allocate new space. It should go into the free space at the end of the
  // segment.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(0, builder2.allocations.size());

  EXPECT_EQ(kj::implicitCast<void*>(buffer + segs[0].size()),
            kj::implicitCast<void*>(builder2.getRoot<TestAllTypes>().getTextField().begin()));
}